

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Atom AVar2;
  undefined8 uVar3;
  long lVar4;
  Display *pDVar5;
  char *pcVar6;
  unsigned_long uVar7;
  long lVar8;
  Atom AVar9;
  Window WVar10;
  ulong uVar11;
  undefined8 uStackY_170;
  long *plVar12;
  size_t sVar13;
  undefined4 local_158 [2];
  XEvent reply;
  Atom targets [5];
  Atom local_68;
  Atom formats [3];
  
  AVar9 = 0;
  uVar11 = 0;
  memset(local_158,0,0xc0);
  plVar12 = (long *)_glfw.x11.clipboardString;
  pDVar5 = _glfw.x11.display;
  formats[0] = _glfw.x11.COMPOUND_STRING;
  formats[1] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_00128297;
  AVar2 = (event->xkey).time;
  if (AVar2 == _glfw.x11.TARGETS) {
    plVar12 = reply.pad + 0x17;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = _glfw.x11.COMPOUND_STRING;
    targets[3] = 0x1f;
    WVar10 = (event->xkey).root;
    uStackY_170 = 0x20;
    sVar13 = 5;
    AVar9 = 4;
    reply.pad[0x17] = AVar2;
LAB_00128141:
    XChangeProperty(pDVar5,WVar10,AVar1,AVar9,uStackY_170,0,plVar12,sVar13);
  }
  else {
    if (AVar2 != _glfw.x11.MULTIPLE) {
      if (AVar2 == _glfw.x11.SAVE_TARGETS) {
        WVar10 = (event->xkey).root;
        sVar13 = uVar11 & 0xffffffff00000000;
        plVar12 = (long *)0x0;
        uStackY_170 = 0x20;
        AVar9 = _glfw.x11.NULL_;
      }
      else {
        AVar9 = 0;
        lVar8 = 0;
        do {
          if (lVar8 == 3) goto LAB_00128297;
          lVar4 = lVar8 + -1;
          lVar8 = lVar8 + 1;
        } while (AVar2 != formats[lVar4]);
        WVar10 = (event->xkey).root;
        sVar13 = strlen(_glfw.x11.clipboardString);
        uStackY_170 = 8;
        AVar9 = AVar2;
      }
      goto LAB_00128141;
    }
    uVar7 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)(reply.pad + 0x17));
    for (uVar11 = 0; pcVar6 = _glfw.x11.clipboardString, pDVar5 = _glfw.x11.display, uVar11 < uVar7;
        uVar11 = uVar11 + 2) {
      AVar1 = *(Atom *)(reply.pad[0x17] + uVar11 * 8);
      lVar8 = 0;
      do {
        if (lVar8 == 3) {
          *(undefined8 *)(reply.pad[0x17] + 8 + uVar11 * 8) = 0;
          goto LAB_00128210;
        }
        lVar4 = lVar8 + -1;
        lVar8 = lVar8 + 1;
      } while (AVar1 != formats[lVar4]);
      WVar10 = (event->xkey).root;
      uVar3 = *(undefined8 *)(reply.pad[0x17] + 8 + uVar11 * 8);
      sVar13 = strlen(_glfw.x11.clipboardString);
      XChangeProperty(pDVar5,WVar10,uVar3,AVar1,8,0,pcVar6,sVar13);
LAB_00128210:
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0);
    XFree(reply.pad[0x17]);
  }
  AVar9 = (event->xselectionrequest).property;
LAB_00128297:
  local_158[0] = 0x1f;
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar9;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}